

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

string * __thiscall
nlohmann::json_abi_v3_11_3::detail::
parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::exception_message(string *__return_storage_ptr__,
                   parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *this,token_type expected,string *context)

{
  char *pcVar1;
  size_t sVar2;
  char *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_59;
  char *local_58;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"syntax error ","");
  if (context->_M_string_length != 0) {
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              (&local_80,context->_M_string_length + 0xf);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_80,"while parsing ");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_80,(context->_M_dataplus)._M_p,context->_M_string_length);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_80,' ');
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,local_80._M_dataplus._M_p,local_80._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
    }
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,"- ");
  if (this->last_token == parse_error) {
    local_58 = (this->m_lexer).error_message;
    lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::get_token_string(&local_50,&this->m_lexer);
    local_59 = 0x27;
    concat<std::__cxx11::string,char_const*,char_const(&)[15],std::__cxx11::string,char>
              (&local_80,(detail *)&local_58,(char **)"; last read: \'",(char (*) [15])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_59,in_R9)
    ;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,local_80._M_dataplus._M_p,local_80._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_003c2cd1;
  }
  else {
    pcVar1 = lexer_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
             ::token_type_name(this->last_token);
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    sVar2 = strlen(pcVar1);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              (&local_80,sVar2 + 0xb);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_80,"unexpected ");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_80,pcVar1);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,local_80._M_dataplus._M_p,local_80._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) goto LAB_003c2cd1;
    local_50.field_2._M_allocated_capacity =
         CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,local_80.field_2._M_local_buf[0]);
    local_50._M_dataplus._M_p = local_80._M_dataplus._M_p;
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
LAB_003c2cd1:
  if (expected != uninitialized) {
    pcVar1 = lexer_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
             ::token_type_name(expected);
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    sVar2 = strlen(pcVar1);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              (&local_80,sVar2 + 0xb);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_80,"; expected ");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_80,pcVar1);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,local_80._M_dataplus._M_p,local_80._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string exception_message(const token_type expected, const std::string& context)
    {
        std::string error_msg = "syntax error ";

        if (!context.empty())
        {
            error_msg += concat("while parsing ", context, ' ');
        }

        error_msg += "- ";

        if (last_token == token_type::parse_error)
        {
            error_msg += concat(m_lexer.get_error_message(), "; last read: '",
                                m_lexer.get_token_string(), '\'');
        }
        else
        {
            error_msg += concat("unexpected ", lexer_t::token_type_name(last_token));
        }

        if (expected != token_type::uninitialized)
        {
            error_msg += concat("; expected ", lexer_t::token_type_name(expected));
        }

        return error_msg;
    }